

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O0

void __thiscall
sjtu::OrderManager::refund_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  **ppDVar1;
  bool bVar2;
  void *pvVar3;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar4;
  char *__src;
  size_t sVar5;
  long lVar6;
  int in_ECX;
  OrderManager *in_RSI;
  long in_RDI;
  long in_R8;
  pair<unsigned_long_long,_int> pVar7;
  orderType *in_stack_000000e0;
  TrainManager *in_stack_000000e8;
  pair<sjtu::orderType,_long> *ret;
  int i_1;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> pendinglist;
  orderType *tmp;
  int i;
  int number;
  string uname;
  size_t *in_stack_fffffffffffffdc8;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *in_stack_fffffffffffffdd0;
  orderType *in_stack_fffffffffffffde0;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  string *in_stack_fffffffffffffdf8;
  StringHasher *in_stack_fffffffffffffe00;
  long *plVar8;
  string *in_stack_fffffffffffffe50;
  UserManager *in_stack_fffffffffffffe58;
  pair<unsigned_long_long,_int> *keyr;
  pair<unsigned_long_long,_int> *keyl;
  orderType *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe8c;
  int n;
  int in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  int local_13c;
  allocator local_121;
  string local_120 [32];
  hashType local_100;
  unsigned_long_long local_f8;
  int local_f0;
  unsigned_long_long local_e8;
  int local_e0;
  undefined4 local_d8;
  undefined1 local_d1 [33];
  hashType local_b0;
  unsigned_long_long local_a8;
  int local_a0;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> local_98;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_88;
  string local_80 [48];
  int local_50;
  int local_4c;
  orderType *in_stack_ffffffffffffffb8;
  TrainManager *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8);
  local_4c = 1;
  for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 2) {
    in_stack_fffffffffffffe9f =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    if ((bool)in_stack_fffffffffffffe9f) {
      std::__cxx11::string::operator=
                ((string *)&stack0xffffffffffffffb8,(string *)((long)local_50 * 0x20 + 0x20 + in_R8)
                );
    }
    else {
      in_stack_fffffffffffffe9e =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      if ((bool)in_stack_fffffffffffffe9e) {
        in_stack_fffffffffffffe98 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,0);
        local_4c = in_stack_fffffffffffffe98;
      }
    }
  }
  std::__cxx11::string::string(local_80,(string *)&stack0xffffffffffffffb8);
  bVar2 = UserManager::is_login(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  n = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe8c);
  std::__cxx11::string::~string(local_80);
  if (bVar2) {
    pBVar4 = (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *)operator_new(0xb8);
    orderType::orderType(in_stack_fffffffffffffde0);
    local_88 = pBVar4;
    __src = (char *)std::__cxx11::string::c_str();
    strcpy((char *)pBVar4,__src);
    bVar2 = UserManager::refund_order
                      ((UserManager *)
                       CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98))),in_RSI,n,
                       in_stack_fffffffffffffe80);
    if (bVar2) {
      if (local_88[7].depth == 0) {
        TrainManager::refund_ticket(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        keyr = (pair<unsigned_long_long,_int> *)((long)&local_88->file + 5);
        keyl = (pair<unsigned_long_long,_int> *)local_d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_d1 + 1),(char *)keyr,(allocator *)keyl);
        local_b0 = StringHasher::operator()(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        local_d8 = 0;
        pVar7 = std::make_pair<unsigned_long_long,int>
                          ((unsigned_long_long *)in_stack_fffffffffffffdd0,
                           (int *)in_stack_fffffffffffffdc8);
        local_e8 = pVar7.first;
        local_e0 = pVar7.second;
        ppDVar1 = &local_88->file;
        local_a8 = local_e8;
        local_a0 = local_e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,(char *)((long)ppDVar1 + 5),&local_121);
        local_100 = StringHasher::operator()(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        pVar7 = std::make_pair<unsigned_long_long,int>
                          ((unsigned_long_long *)in_stack_fffffffffffffdd0,
                           (int *)in_stack_fffffffffffffdc8);
        local_f8 = pVar7.first;
        local_f0 = pVar7.second;
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::range_query(pBVar4,keyl,keyr);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        std::__cxx11::string::~string((string *)(local_d1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_d1);
        for (local_13c = 0;
            sVar5 = vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::size
                              (&local_98), (ulong)(long)local_13c < sVar5; local_13c = local_13c + 1
            ) {
          plVar8 = *(long **)(in_RDI + 0x10);
          vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::operator[]
                    ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)
                     CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                     (size_t *)in_stack_fffffffffffffde8);
          lVar6 = (**(code **)(*plVar8 + 0x10))();
          if (((*(int *)(lVar6 + 0xa8) != 2) &&
              (in_stack_fffffffffffffdf7 =
                    TrainManager::buy_ticket(in_stack_000000e8,in_stack_000000e0),
              (bool)in_stack_fffffffffffffdf7)) && (*(int *)(lVar6 + 0xa8) != 1)) {
            (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),lVar6 + 0xb0)
            ;
            pBVar4 = *(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
                       **)(in_RDI + 8);
            in_stack_fffffffffffffde8 =
                 vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::operator[]
                           ((vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                            (size_t *)in_stack_fffffffffffffde8);
            BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
            ::erase(pBVar4,&in_stack_fffffffffffffde8->first);
          }
        }
        vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::~vector
                  (in_stack_fffffffffffffdd0);
      }
      pvVar3 = (void *)std::ostream::operator<<(&std::cout,0);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    if (local_88 !=
        (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
         *)0x0) {
      operator_delete(local_88,0xb8);
    }
  }
  else {
    pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void refund_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname;
            int number = 1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-n") number = stoi(argv[i + 1]);
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                if (user_manager->refund_order(this, number, tmp)) {
                    if (tmp -> status == success)
                    {
                        train_manager -> refund_ticket(tmp);
                        auto pendinglist = PendingBpTree -> range_query(
                                std::make_pair(hasher(tmp -> trainID) , 0) ,
                                std::make_pair(hasher(tmp -> trainID) , 0x7fffffff));
                        for (int i = 0 ; i < pendinglist . size() ; ++ i)
                        {
                            auto ret = OrderFile -> read(pendinglist[i] . second);
                            if (ret -> first . status != refunded && train_manager -> buy_ticket(&(ret -> first)))
                                if (ret -> first . status != pending)
                                {
                                    OrderFile -> save(ret -> first . offset);
                                    PendingBpTree -> erase(pendinglist[i] . first);
                                }
                        }
                    }
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
                delete tmp;
            }
        }